

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall basisu::basis_compressor::create_ktx2_file(basis_compressor *this)

{
  int iVar1;
  char *__src;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  basisu_backend_slice_desc *pbVar6;
  vector<unsigned_char> *pvVar7;
  uint *puVar8;
  ktx2_etc1s_image_desc *pkVar9;
  key_value *pkVar10;
  uchar *puVar11;
  size_t sVar12;
  ktx2_level_index *pkVar13;
  ulong v;
  bool_param *in_RDI;
  int level;
  uint32_t i_4;
  uint32_t padding_2;
  uint32_t ofs_2;
  uint32_t i_3;
  uint32_t padding_1;
  uint32_t ofs_1;
  uint32_t dfd_len;
  uint8_t *pDFD;
  vector<basist::ktx2_level_index> level_index_array;
  uint32_t i_2;
  uint32_t bytes_needed_to_pad;
  uint32_t kvd_end_file_offset;
  uint32_t p;
  uint32_t padding;
  uint32_t ofs;
  packed_uint<4U> le_len;
  uint64_t total_len;
  uint32_t i_1;
  uint32_t pass;
  uint32_t kvd_file_offset;
  uint8_vec dfd;
  uint8_vec key_value_data;
  char writer_id [128];
  char *pKTXwriter;
  key_value_vec key_values;
  uint32_t etc1s_image_index;
  uint32_t face_index;
  uint32_t layer_index;
  uint32_t level_index;
  basisu_backend_slice_desc *slice_desc_1;
  uint32_t slice_index_1;
  vector<basist::ktx2_etc1s_image_desc> etc1s_image_descs;
  ktx2_etc1s_global_data_header etc1s_global_data_header;
  uint8_vec etc1s_global_data;
  basisu_backend_slice_desc *slice_desc;
  uint32_t slice_index;
  uint_vec slice_level_offsets;
  vector<basisu::vector<unsigned_char>_> compressed_level_data_bytes;
  vector<basisu::vector<unsigned_char>_> level_data_bytes;
  ktx2_header header;
  uint32_t i;
  uint32_t total_faces;
  uint32_t total_levels;
  uint32_t total_layers;
  uint32_t base_height;
  uint32_t base_width;
  basisu_backend_output *backend_output;
  undefined4 in_stack_fffffffffffffa78;
  uint32_t in_stack_fffffffffffffa7c;
  ktx2_etc1s_global_data_header *in_stack_fffffffffffffa80;
  vector<unsigned_char> *in_stack_fffffffffffffa88;
  ktx2_header *in_stack_fffffffffffffa90;
  vector<basist::ktx2_transcoder::key_value> *in_stack_fffffffffffffa98;
  basis_compressor *in_stack_fffffffffffffaa0;
  size_t in_stack_fffffffffffffaa8;
  vector<unsigned_char> *in_stack_fffffffffffffab0;
  uint local_280;
  uint local_268;
  uint local_260;
  uint local_250;
  vector<basist::ktx2_level_index> local_238;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  uint local_220;
  uint local_21c;
  uint local_218;
  undefined1 local_211;
  uint local_210;
  uint local_20c;
  uint local_208;
  ulong local_200;
  undefined4 local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint32_t local_1ec;
  vector<unsigned_char> local_1e8;
  vector<unsigned_char> local_1d8;
  char local_1c8 [136];
  char *local_140;
  vector<basist::ktx2_transcoder::key_value> local_138;
  int local_128;
  uint local_124;
  uint local_120;
  uint32_t local_11c;
  basisu_backend_slice_desc *local_118;
  uint local_10c;
  vector<basist::ktx2_etc1s_image_desc> local_108;
  packed_uint<2U> local_f4;
  packed_uint<2U> local_f2;
  packed_uint<4U> local_f0;
  packed_uint<4U> local_ec;
  packed_uint<4U> local_e8 [2];
  vector<unsigned_char> local_e0;
  basisu_backend_slice_desc *local_d0;
  uint local_c4;
  undefined8 local_80;
  undefined4 uStack_78;
  packed_uint<4U> pStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  packed_uint<8U> local_40;
  packed_uint<8U> pStack_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint32_t local_20;
  uint32_t local_1c;
  basisu_backend_output *local_18;
  byte local_1;
  
  bVar2 = bool_param::operator_cast_to_bool(in_RDI);
  if (((bVar2) && (*(int *)(in_RDI + 0x214) != 0)) && (*(int *)(in_RDI + 0x214) != 2)) {
    local_1 = 0;
  }
  else {
    local_18 = basisu_backend::get_output((basisu_backend *)(in_RDI + 0x498));
    local_1c = 0;
    local_20 = 0;
    local_24 = 0;
    local_28 = 0;
    local_2c = 1;
    for (local_30 = 0; uVar5 = local_30,
        uVar3 = vector<basisu::basisu_backend_slice_desc>::size
                          ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
        uVar5 < uVar3; local_30 = local_30 + 1) {
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      if ((pbVar6->m_mip_index == 0) && (local_1c == 0)) {
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        local_1c = pbVar6->m_orig_width;
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        local_20 = pbVar6->m_orig_height;
      }
      uVar5 = local_24;
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      local_24 = maximum<unsigned_int>(uVar5,pbVar6->m_source_file_index + 1);
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      uVar5 = local_28;
      if (pbVar6->m_source_file_index == 0) {
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        local_28 = maximum<unsigned_int>(uVar5,pbVar6->m_mip_index + 1);
      }
    }
    if (*(int *)(in_RDI + 0x134) == 2) {
      if (local_24 % 6 != 0) {
        __assert_fail("(total_layers % 6) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x716,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      local_24 = local_24 / 6;
      if (local_24 == 0) {
        __assert_fail("total_layers >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x719,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      local_2c = 6;
    }
    memset(&local_80,0,0xc);
    packed_uint<4U>::packed_uint(&pStack_74);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&local_70);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&local_70 + 4));
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&uStack_68);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&uStack_68 + 4));
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&local_60);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&local_60 + 4));
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&uStack_58);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&uStack_58 + 4));
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&local_50);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&local_50 + 4));
    packed_uint<4U>::packed_uint((packed_uint<4U> *)&uStack_48);
    packed_uint<4U>::packed_uint((packed_uint<4U> *)((long)&uStack_48 + 4));
    packed_uint<8U>::packed_uint(&local_40);
    packed_uint<8U>::packed_uint(&pStack_38);
    memset(&local_80,0,0x50);
    local_80 = 0xbb30322058544bab;
    uStack_78 = 0xa1a0a0d;
    packed_uint<4U>::operator=((packed_uint<4U> *)((long)&local_70 + 4),(ulong)local_1c);
    packed_uint<4U>::operator=((packed_uint<4U> *)&uStack_68,(ulong)local_20);
    packed_uint<4U>::operator=((packed_uint<4U> *)((long)&local_60 + 4),(ulong)local_2c);
    packed_uint<4U>::operator=(&pStack_74,0);
    packed_uint<4U>::operator=((packed_uint<4U> *)&local_70,1);
    packed_uint<4U>::operator=((packed_uint<4U> *)&uStack_58,(ulong)local_28);
    if (local_24 < 2) {
      local_280 = 0;
    }
    else {
      local_280 = local_24;
    }
    packed_uint<4U>::operator=((packed_uint<4U> *)&local_60,(ulong)local_280);
    bVar2 = bool_param::operator_cast_to_bool(in_RDI);
    if (bVar2) {
      if (*(int *)(in_RDI + 0x214) == 0) {
        packed_uint<4U>::operator=((packed_uint<4U> *)((long)&uStack_58 + 4),0);
      }
      else {
        if (*(int *)(in_RDI + 0x214) != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                        ,0x73c,"bool basisu::basis_compressor::create_ktx2_file()");
        }
        packed_uint<4U>::operator=((packed_uint<4U> *)((long)&uStack_58 + 4),0);
      }
    }
    vector<basisu::vector<unsigned_char>_>::vector
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    vector<basisu::vector<unsigned_char>_>::vector
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    vector<basisu::basisu_backend_slice_desc>::size
              ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
    vector<unsigned_int>::vector
              ((vector<unsigned_int> *)in_stack_fffffffffffffa80,
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    for (local_c4 = 0; uVar5 = local_c4,
        uVar3 = vector<basisu::basisu_backend_slice_desc>::size
                          ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
        uVar5 < uVar3; local_c4 = local_c4 + 1) {
      local_d0 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      uVar3 = vector<unsigned_char>::size(pvVar7);
      puVar8 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      *puVar8 = uVar3;
      bVar2 = bool_param::operator_cast_to_bool(in_RDI);
      if (bVar2) {
        vector<basisu::vector<unsigned_char>_>::operator[]
                  ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        vector<basisu::vector<unsigned_char>_>::operator[]
                  ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        append_vector<basisu::vector<unsigned_char>>
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      }
      else {
        vector<basisu::vector<unsigned_char>_>::operator[]
                  ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        vector<basisu::vector<unsigned_char>_>::operator[]
                  ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        append_vector<basisu::vector<unsigned_char>>
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      }
    }
    bVar2 = bool_param::operator_cast_to_bool(in_RDI);
    if ((bVar2) &&
       (uVar3 = packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)in_stack_fffffffffffffa90), uVar3 == 2)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                    ,0x764,"bool basisu::basis_compressor::create_ktx2_file()");
    }
    vector<basisu::vector<unsigned_char>_>::operator=
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa98,
               (vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa90);
    vector<unsigned_char>::vector(&local_e0);
    bVar2 = bool_param::operator_cast_to_bool(in_RDI);
    if (!bVar2) {
      basist::ktx2_etc1s_global_data_header::ktx2_etc1s_global_data_header
                (in_stack_fffffffffffffa80);
      clear_obj<basist::ktx2_etc1s_global_data_header>((ktx2_etc1s_global_data_header *)0x4be607);
      packed_uint<2U>::operator=(&local_f4,(ulong)local_18->m_num_endpoints);
      packed_uint<2U>::operator=(&local_f2,(ulong)local_18->m_num_selectors);
      uVar3 = vector<unsigned_char>::size(&local_18->m_endpoint_palette);
      packed_uint<4U>::operator=(&local_f0,(ulong)uVar3);
      uVar3 = vector<unsigned_char>::size(&local_18->m_selector_palette);
      packed_uint<4U>::operator=(&local_ec,(ulong)uVar3);
      uVar3 = vector<unsigned_char>::size(&local_18->m_slice_image_tables);
      packed_uint<4U>::operator=(local_e8,(ulong)uVar3);
      vector<basist::ktx2_etc1s_image_desc>::vector
                ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      pkVar9 = vector<basist::ktx2_etc1s_image_desc>::data(&local_108);
      uVar3 = vector<basist::ktx2_etc1s_image_desc>::size_in_bytes(&local_108);
      memset(pkVar9,0,(ulong)uVar3);
      for (local_10c = 0; uVar5 = local_10c,
          uVar3 = vector<basisu::basisu_backend_slice_desc>::size
                            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
          uVar5 < uVar3; local_10c = local_10c + 1) {
        local_118 = vector<basisu::basisu_backend_slice_desc>::operator[]
                              ((vector<basisu::basisu_backend_slice_desc> *)
                               in_stack_fffffffffffffa80,
                               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        local_11c = local_118->m_mip_index;
        local_120 = local_118->m_source_file_index;
        local_124 = 0;
        if (*(int *)(in_RDI + 0x134) == 2) {
          local_124 = local_120 % 6;
          local_120 = local_120 / 6;
        }
        local_128 = local_11c * local_24 * local_2c + local_120 * local_2c + local_124;
        if ((local_118->m_alpha & 1U) == 0) {
          if (*(int *)(in_RDI + 0x134) == 3) {
            bVar2 = local_118->m_iframe;
            pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                               ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                                CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            packed_uint<4U>::operator=(&pkVar9->m_image_flags,(ulong)(((byte)~bVar2 & 1) * 2));
          }
          pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                             ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          uVar3 = vector<unsigned_char>::size(pvVar7);
          pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                             ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          packed_uint<4U>::operator=(&pkVar9->m_rgb_slice_byte_length,(ulong)uVar3);
          puVar8 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          uVar5 = *puVar8;
          pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                             ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          packed_uint<4U>::operator=(&pkVar9->m_rgb_slice_byte_offset,(ulong)uVar5);
        }
        else {
          pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                             ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          uVar3 = vector<unsigned_char>::size(pvVar7);
          pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                             ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          packed_uint<4U>::operator=(&pkVar9->m_alpha_slice_byte_length,(ulong)uVar3);
          puVar8 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          uVar5 = *puVar8;
          pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                             ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80,
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          packed_uint<4U>::operator=(&pkVar9->m_alpha_slice_byte_offset,(ulong)uVar5);
        }
      }
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                ((vector<unsigned_char> *)in_stack_fffffffffffffaa0,
                 (uchar *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
      vector<basist::ktx2_etc1s_image_desc>::data(&local_108);
      vector<basist::ktx2_etc1s_image_desc>::size_in_bytes(&local_108);
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                ((vector<unsigned_char> *)in_stack_fffffffffffffaa0,
                 (uchar *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      packed_uint<4U>::operator=((packed_uint<4U> *)((long)&uStack_58 + 4),1);
      vector<basist::ktx2_etc1s_image_desc>::~vector
                ((vector<basist::ktx2_etc1s_image_desc> *)in_stack_fffffffffffffa80);
    }
    vector<basist::ktx2_transcoder::key_value>::vector
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    vector<basist::ktx2_transcoder::key_value>::enlarge
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa7c);
    local_140 = "KTXwriter";
    vector<basist::ktx2_transcoder::key_value>::back
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    strlen(local_140);
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88,
               SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0));
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back
                        ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    puVar11 = vector<unsigned_char>::data(&pkVar10->m_key);
    __src = local_140;
    sVar12 = strlen(local_140);
    memcpy(puVar11,__src,sVar12 + 1);
    snprintf(local_1c8,0x80,"Basis Universal %s","1.16");
    vector<basist::ktx2_transcoder::key_value>::back
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    strlen(local_1c8);
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88,
               SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0));
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back
                        ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    puVar11 = vector<unsigned_char>::data(&pkVar10->m_value);
    sVar12 = strlen(local_1c8);
    memcpy(puVar11,local_1c8,sVar12 + 1);
    vector<basist::ktx2_transcoder::key_value>::sort
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    vector<unsigned_char>::vector(&local_1d8);
    vector<unsigned_char>::vector(&local_1e8);
    get_dfd(in_stack_fffffffffffffaa0,(uint8_vec *)in_stack_fffffffffffffa98,
            in_stack_fffffffffffffa90);
    iVar1 = local_28 * 0x18;
    local_1ec = vector<unsigned_char>::size(&local_1e8);
    local_1ec = iVar1 + 0x50 + local_1ec;
    for (local_1f0 = 0; local_1f0 < 2; local_1f0 = local_1f0 + 1) {
      for (local_1f4 = 0; uVar5 = local_1f4,
          uVar3 = vector<basist::ktx2_transcoder::key_value>::size(&local_138), uVar5 < uVar3;
          local_1f4 = local_1f4 + 1) {
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[]
                            ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80
                             ,CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        uVar3 = vector<unsigned_char>::size(&pkVar10->m_key);
        if (uVar3 < 2) {
          local_1 = 0;
          local_1f8 = 1;
          goto LAB_004bfc42;
        }
        vector<basist::ktx2_transcoder::key_value>::operator[]
                  ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        puVar11 = vector<unsigned_char>::back((vector<unsigned_char> *)in_stack_fffffffffffffa80);
        if (*puVar11 != '\0') {
          local_1 = 0;
          local_1f8 = 1;
          goto LAB_004bfc42;
        }
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[]
                            ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80
                             ,CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        uVar3 = vector<unsigned_char>::size(&pkVar10->m_key);
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[]
                            ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80
                             ,CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        uVar4 = vector<unsigned_char>::size(&pkVar10->m_value);
        local_200 = (ulong)uVar3 + (ulong)uVar4;
        if (0xfffffffe < local_200) {
          local_1 = 0;
          local_1f8 = 1;
          goto LAB_004bfc42;
        }
        packed_uint<4U>::packed_uint
                  ((packed_uint<4U> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        append_vector<basisu::vector<unsigned_char>,unsigned_char>
                  ((vector<unsigned_char> *)in_stack_fffffffffffffaa0,
                   (uchar *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
        vector<basist::ktx2_transcoder::key_value>::operator[]
                  ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        append_vector<basisu::vector<unsigned_char>>
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        vector<basist::ktx2_transcoder::key_value>::operator[]
                  ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80,
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        append_vector<basisu::vector<unsigned_char>>
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        uVar3 = vector<unsigned_char>::size(&local_1d8);
        local_208 = uVar3 & 3;
        local_20c = 4 - local_208 & 3;
        for (local_210 = 0; local_210 < local_20c; local_210 = local_210 + 1) {
          local_211 = 0;
          vector<unsigned_char>::push_back
                    ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                     (uchar *)in_stack_fffffffffffffa88);
        }
      }
      uVar4 = packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)in_stack_fffffffffffffa90);
      uVar3 = local_1ec;
      if (uVar4 != 0) break;
      uVar4 = vector<unsigned_char>::size(&local_1d8);
      local_218 = uVar3 + uVar4;
      local_21c = 0x10 - (local_218 & 0xf) & 0xf;
      if (local_21c == 0) break;
      if (local_1f0 != 0) {
        __assert_fail("!pass",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x7f1,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      if (local_21c < 6) {
        local_21c = local_21c + 0x10;
      }
      printf("WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n"
             ,(ulong)local_21c);
      vector<basist::ktx2_transcoder::key_value>::enlarge
                ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa7c);
      for (local_220 = 0; local_220 < local_21c - 6; local_220 = local_220 + 1) {
        vector<basist::ktx2_transcoder::key_value>::back
                  ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
        local_221 = 0x7f;
        vector<unsigned_char>::push_back
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                   (uchar *)in_stack_fffffffffffffa88);
      }
      vector<basist::ktx2_transcoder::key_value>::back
                ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
      local_222 = 0;
      vector<unsigned_char>::push_back
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                 (uchar *)in_stack_fffffffffffffa88);
      vector<basist::ktx2_transcoder::key_value>::back
                ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
      local_223 = 0;
      vector<unsigned_char>::push_back
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                 (uchar *)in_stack_fffffffffffffa88);
      vector<basist::ktx2_transcoder::key_value>::sort
                ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
      vector<unsigned_char>::resize
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                 (size_t)in_stack_fffffffffffffa88,SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0)
                );
    }
    vector<basist::ktx2_level_index>::vector
              ((vector<basist::ktx2_level_index> *)in_stack_fffffffffffffa80,
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    pkVar13 = vector<basist::ktx2_level_index>::data(&local_238);
    uVar3 = vector<basist::ktx2_level_index>::size_in_bytes(&local_238);
    memset(pkVar13,0,(ulong)uVar3);
    vector<unsigned_char>::clear((vector<unsigned_char> *)in_stack_fffffffffffffa80);
    vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6a8));
    vector<unsigned_char>::reserve(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88,
               SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0));
    vector<basist::ktx2_level_index>::data(&local_238);
    vector<basist::ktx2_level_index>::size_in_bytes(&local_238);
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              ((vector<unsigned_char> *)in_stack_fffffffffffffaa0,(uchar *)in_stack_fffffffffffffa98
               ,(size_t)in_stack_fffffffffffffa90);
    vector<unsigned_char>::data(&local_1e8);
    uVar3 = vector<unsigned_char>::size(&local_1e8);
    uVar4 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
    packed_uint<4U>::operator=((packed_uint<4U> *)&local_50,(ulong)uVar4);
    packed_uint<4U>::operator=((packed_uint<4U> *)((long)&local_50 + 4),(ulong)uVar3);
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              ((vector<unsigned_char> *)in_stack_fffffffffffffaa0,(uchar *)in_stack_fffffffffffffa98
               ,(size_t)in_stack_fffffffffffffa90);
    uVar4 = vector<unsigned_char>::size(&local_1d8);
    uVar3 = local_1ec;
    if (uVar4 != 0) {
      uVar4 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      if (uVar3 != uVar4) {
        __assert_fail("kvd_file_offset == m_output_ktx2_file.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x822,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      packed_uint<4U>::operator=((packed_uint<4U> *)&uStack_48,(ulong)uVar3);
      uVar3 = vector<unsigned_char>::size(&local_1d8);
      packed_uint<4U>::operator=((packed_uint<4U> *)((long)&uStack_48 + 4),(ulong)uVar3);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    uVar3 = vector<unsigned_char>::size(&local_e0);
    if (uVar3 != 0) {
      uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      for (local_250 = 0; local_250 < (8 - (uVar3 & 7) & 7); local_250 = local_250 + 1) {
        vector<unsigned_char>::push_back
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                   (uchar *)in_stack_fffffffffffffa88);
      }
      uVar3 = vector<unsigned_char>::size(&local_e0);
      packed_uint<8U>::operator=(&pStack_38,(ulong)uVar3);
      uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      packed_uint<8U>::operator=(&local_40,(ulong)uVar3);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)in_stack_fffffffffffffa90)
    ;
    local_268 = local_28;
    if (uVar3 == 0) {
      uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      uVar5 = 0x10 - (uVar3 & 0xf) & 0xf;
      if (uVar5 != 0) {
        printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n"
               ,(ulong)uVar5);
      }
      for (local_260 = 0; local_268 = local_28, local_260 < uVar5; local_260 = local_260 + 1) {
        vector<unsigned_char>::push_back
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa90,
                   (uchar *)in_stack_fffffffffffffa88);
      }
    }
    while (local_268 = local_268 - 1, -1 < (int)local_268) {
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      uVar3 = vector<unsigned_char>::size(pvVar7);
      pkVar13 = vector<basist::ktx2_level_index>::operator[]
                          ((vector<basist::ktx2_level_index> *)in_stack_fffffffffffffa80,
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      packed_uint<8U>::operator=(&pkVar13->m_byte_length,(ulong)uVar3);
      bVar2 = bool_param::operator_cast_to_bool(in_RDI);
      if (bVar2) {
        pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                           ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        uVar3 = vector<unsigned_char>::size(pvVar7);
        pkVar13 = vector<basist::ktx2_level_index>::operator[]
                            ((vector<basist::ktx2_level_index> *)in_stack_fffffffffffffa80,
                             CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        packed_uint<8U>::operator=(&pkVar13->m_uncompressed_byte_length,(ulong)uVar3);
      }
      uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
      v = (ulong)uVar3;
      pkVar13 = vector<basist::ktx2_level_index>::operator[]
                          ((vector<basist::ktx2_level_index> *)in_stack_fffffffffffffa80,
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      packed_uint<8U>::operator=(&pkVar13->m_byte_offset,v);
      vector<basisu::vector<unsigned_char>_>::operator[]
                ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    puVar11 = vector<unsigned_char>::data((vector<unsigned_char> *)(in_RDI + 0x6b8));
    *(uint8_t (*) [8])(puVar11 + 0x40) = local_40.m_bytes;
    *(uint8_t (*) [8])(puVar11 + 0x48) = pStack_38.m_bytes;
    *(undefined8 *)(puVar11 + 0x30) = local_50;
    *(undefined8 *)(puVar11 + 0x38) = uStack_48;
    *(undefined8 *)(puVar11 + 0x20) = local_60;
    *(undefined8 *)(puVar11 + 0x28) = uStack_58;
    *(undefined8 *)(puVar11 + 0x10) = local_70;
    *(undefined8 *)(puVar11 + 0x18) = uStack_68;
    *(undefined8 *)puVar11 = local_80;
    *(ulong *)(puVar11 + 8) = CONCAT44(pStack_74.m_bytes,uStack_78);
    puVar11 = vector<unsigned_char>::data((vector<unsigned_char> *)(in_RDI + 0x6b8));
    in_stack_fffffffffffffa80 = (ktx2_etc1s_global_data_header *)(puVar11 + 0x50);
    pkVar13 = vector<basist::ktx2_level_index>::data(&local_238);
    uVar3 = vector<basist::ktx2_level_index>::size_in_bytes(&local_238);
    memcpy(in_stack_fffffffffffffa80,pkVar13,(ulong)uVar3);
    uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x6b8));
    debug_printf("Total .ktx2 output file size: %u\n",(ulong)uVar3);
    local_1 = 1;
    local_1f8 = 1;
    vector<basist::ktx2_level_index>::~vector
              ((vector<basist::ktx2_level_index> *)in_stack_fffffffffffffa80);
LAB_004bfc42:
    vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffa80);
    vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffa80);
    vector<basist::ktx2_transcoder::key_value>::~vector
              ((vector<basist::ktx2_transcoder::key_value> *)in_stack_fffffffffffffa80);
    vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffa80);
    vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffa80);
    vector<basisu::vector<unsigned_char>_>::~vector
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80);
    vector<basisu::vector<unsigned_char>_>::~vector
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffa80);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool basis_compressor::create_ktx2_file()
	{
		if (m_params.m_uastc)
		{
			if ((m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_NONE) && (m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_ZSTANDARD))
				return false;
		}

		const basisu_backend_output& backend_output = m_backend.get_output();

		// Determine the width/height, number of array layers, mipmap levels, and the number of faces (1 for 2D, 6 for cubemap).
		// This does not support 1D or 3D.
		uint32_t base_width = 0, base_height = 0, total_layers = 0, total_levels = 0, total_faces = 1;
				
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if ((m_slice_descs[i].m_mip_index == 0) && (!base_width))
			{
				base_width = m_slice_descs[i].m_orig_width;
				base_height = m_slice_descs[i].m_orig_height;
			}

			total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);

			if (!m_slice_descs[i].m_source_file_index)
				total_levels = maximum<uint32_t>(total_levels, m_slice_descs[i].m_mip_index + 1);
		}

		if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
		{
			assert((total_layers % 6) == 0);
			
			total_layers /= 6;
			assert(total_layers >= 1);

			total_faces = 6;
		}

		basist::ktx2_header header = {};
		memset((void*)&header, 0, sizeof(header));

		memcpy(header.m_identifier, basist::g_ktx2_file_identifier, sizeof(basist::g_ktx2_file_identifier));
		header.m_pixel_width = base_width;
		header.m_pixel_height = base_height;
		header.m_face_count = total_faces;
		header.m_vk_format = basist::KTX2_VK_FORMAT_UNDEFINED;
		header.m_type_size = 1;
		header.m_level_count = total_levels;
		header.m_layer_count = (total_layers > 1) ? total_layers : 0;

		if (m_params.m_uastc)
		{
			switch (m_params.m_ktx2_uastc_supercompression)
			{
			case basist::KTX2_SS_NONE:
			{
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
				break;
			}
			case basist::KTX2_SS_ZSTANDARD:
			{
#if BASISD_SUPPORT_KTX2_ZSTD
				header.m_supercompression_scheme = basist::KTX2_SS_ZSTANDARD;
#else
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
#endif
				break;
			}
			default: assert(0); return false;
			}
		}

		basisu::vector<uint8_vec> level_data_bytes(total_levels);
		basisu::vector<uint8_vec> compressed_level_data_bytes(total_levels);
		uint_vec slice_level_offsets(m_slice_descs.size());

		// This will append the texture data in the correct order (for each level: layer, then face).
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

			slice_level_offsets[slice_index] = level_data_bytes[slice_desc.m_mip_index].size();

			if (m_params.m_uastc)
				append_vector(level_data_bytes[slice_desc.m_mip_index], m_uastc_backend_output.m_slice_image_data[slice_index]);
			else
				append_vector(level_data_bytes[slice_desc.m_mip_index], backend_output.m_slice_image_data[slice_index]);
		}

		// UASTC supercompression
		if ((m_params.m_uastc) && (header.m_supercompression_scheme == basist::KTX2_SS_ZSTANDARD))
		{
#if BASISD_SUPPORT_KTX2_ZSTD
			for (uint32_t level_index = 0; level_index < total_levels; level_index++)
			{
				compressed_level_data_bytes[level_index].resize(ZSTD_compressBound(level_data_bytes[level_index].size()));

				size_t result = ZSTD_compress(compressed_level_data_bytes[level_index].data(), compressed_level_data_bytes[level_index].size(),
					level_data_bytes[level_index].data(), level_data_bytes[level_index].size(),
					m_params.m_ktx2_zstd_supercompression_level);

				if (ZSTD_isError(result))
					return false;

				compressed_level_data_bytes[level_index].resize(result);
			}
#else
			// Can't get here
			assert(0);
			return false;
#endif
		}
		else
		{
			// No supercompression
			compressed_level_data_bytes = level_data_bytes;
		}
				
		uint8_vec etc1s_global_data;

		// Create ETC1S global supercompressed data
		if (!m_params.m_uastc)
		{
			basist::ktx2_etc1s_global_data_header etc1s_global_data_header;
			clear_obj(etc1s_global_data_header);

			etc1s_global_data_header.m_endpoint_count = backend_output.m_num_endpoints;
			etc1s_global_data_header.m_selector_count = backend_output.m_num_selectors;
			etc1s_global_data_header.m_endpoints_byte_length = backend_output.m_endpoint_palette.size();
			etc1s_global_data_header.m_selectors_byte_length = backend_output.m_selector_palette.size();
			etc1s_global_data_header.m_tables_byte_length = backend_output.m_slice_image_tables.size();

			basisu::vector<basist::ktx2_etc1s_image_desc> etc1s_image_descs(total_levels * total_layers * total_faces);
			memset((void*)etc1s_image_descs.data(), 0, etc1s_image_descs.size_in_bytes());

			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				const uint32_t level_index = slice_desc.m_mip_index;
				uint32_t layer_index = slice_desc.m_source_file_index;
				uint32_t face_index = 0;

				if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
				{
					face_index = layer_index % 6;
					layer_index /= 6;
				}

				const uint32_t etc1s_image_index = level_index * (total_layers * total_faces) + layer_index * total_faces + face_index;

				if (slice_desc.m_alpha)
				{
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_offset = slice_level_offsets[slice_index];
				}
				else
				{
					if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
						etc1s_image_descs[etc1s_image_index].m_image_flags = !slice_desc.m_iframe ? basist::KTX2_IMAGE_IS_P_FRAME : 0;

					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_offset = slice_level_offsets[slice_index];
				}
			} // slice_index

			append_vector(etc1s_global_data, (const uint8_t*)&etc1s_global_data_header, sizeof(etc1s_global_data_header));
			append_vector(etc1s_global_data, (const uint8_t*)etc1s_image_descs.data(), etc1s_image_descs.size_in_bytes());
			append_vector(etc1s_global_data, backend_output.m_endpoint_palette);
			append_vector(etc1s_global_data, backend_output.m_selector_palette);
			append_vector(etc1s_global_data, backend_output.m_slice_image_tables);
			
			header.m_supercompression_scheme = basist::KTX2_SS_BASISLZ;
		}

		// Key values
		basist::ktx2_transcoder::key_value_vec key_values(m_params.m_ktx2_key_values);
		key_values.enlarge(1);
		
		const char* pKTXwriter = "KTXwriter";
		key_values.back().m_key.resize(strlen(pKTXwriter) + 1);
		memcpy(key_values.back().m_key.data(), pKTXwriter, strlen(pKTXwriter) + 1);

		char writer_id[128];
#ifdef _MSC_VER
		sprintf_s(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#else
		snprintf(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#endif
		key_values.back().m_value.resize(strlen(writer_id) + 1);
		memcpy(key_values.back().m_value.data(), writer_id, strlen(writer_id) + 1);

		key_values.sort();

#if BASISU_DISABLE_KTX2_KEY_VALUES
		// HACK HACK - Clear the key values array, which causes no key values to be written (triggering the ktx2check validator bug).
		key_values.clear();
#endif

		uint8_vec key_value_data;

		// DFD
		uint8_vec dfd;
		get_dfd(dfd, header);

		const uint32_t kvd_file_offset = sizeof(header) + sizeof(basist::ktx2_level_index) * total_levels + dfd.size();

		for (uint32_t pass = 0; pass < 2; pass++)
		{
			for (uint32_t i = 0; i < key_values.size(); i++)
			{
				if (key_values[i].m_key.size() < 2)
					return false;

				if (key_values[i].m_key.back() != 0)
					return false;

				const uint64_t total_len = (uint64_t)key_values[i].m_key.size() + (uint64_t)key_values[i].m_value.size();
				if (total_len >= UINT32_MAX)
					return false;

				packed_uint<4> le_len((uint32_t)total_len);
				append_vector(key_value_data, (const uint8_t*)&le_len, sizeof(le_len));

				append_vector(key_value_data, key_values[i].m_key);
				append_vector(key_value_data, key_values[i].m_value);

				const uint32_t ofs = key_value_data.size() & 3;
				const uint32_t padding = (4 - ofs) & 3;
				for (uint32_t p = 0; p < padding; p++)
					key_value_data.push_back(0);
			}

			if (header.m_supercompression_scheme != basist::KTX2_SS_NONE)
				break;

#if BASISU_DISABLE_KTX2_ALIGNMENT_WORKAROUND
			break;
#endif
			
			// Hack to ensure the KVD block ends on a 16 byte boundary, because we have no other official way of aligning the data.
			uint32_t kvd_end_file_offset = kvd_file_offset + key_value_data.size();
			uint32_t bytes_needed_to_pad = (16 - (kvd_end_file_offset & 15)) & 15;
			if (!bytes_needed_to_pad)
			{
				// We're good. No need to add a dummy key.
				break;
			}

			assert(!pass);
			if (pass)
				return false;

			if (bytes_needed_to_pad < 6)
				bytes_needed_to_pad += 16;

			printf("WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n", bytes_needed_to_pad);
			
			// We're not good - need to add a dummy key large enough to force file alignment so the mip level array gets aligned. 
			// We can't just add some bytes before the mip level array because ktx2check will see that as extra data in the file that shouldn't be there in ktxValidator::validateDataSize().
			key_values.enlarge(1);
			for (uint32_t i = 0; i < (bytes_needed_to_pad - 4 - 1 - 1); i++)
				key_values.back().m_key.push_back(127);
			
			key_values.back().m_key.push_back(0);

			key_values.back().m_value.push_back(0);

			key_values.sort();

			key_value_data.resize(0);
			
			// Try again
		}

		basisu::vector<basist::ktx2_level_index> level_index_array(total_levels);
		memset((void*)level_index_array.data(), 0, level_index_array.size_in_bytes());
				
		m_output_ktx2_file.clear();
		m_output_ktx2_file.reserve(m_output_basis_file.size());

		// Dummy header
		m_output_ktx2_file.resize(sizeof(header));

		// Level index array
		append_vector(m_output_ktx2_file, (const uint8_t*)level_index_array.data(), level_index_array.size_in_bytes());
				
		// DFD
		const uint8_t* pDFD = dfd.data();
		uint32_t dfd_len = dfd.size();

		header.m_dfd_byte_offset = m_output_ktx2_file.size();
		header.m_dfd_byte_length = dfd_len;
		append_vector(m_output_ktx2_file, pDFD, dfd_len);

		// Key value data
		if (key_value_data.size())
		{
			assert(kvd_file_offset == m_output_ktx2_file.size());

			header.m_kvd_byte_offset = m_output_ktx2_file.size();
			header.m_kvd_byte_length = key_value_data.size();
			append_vector(m_output_ktx2_file, key_value_data);
		}

		// Global Supercompressed Data
		if (etc1s_global_data.size())
		{
			uint32_t ofs = m_output_ktx2_file.size() & 7;
			uint32_t padding = (8 - ofs) & 7;
			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);

			header.m_sgd_byte_length = etc1s_global_data.size();
			header.m_sgd_byte_offset = m_output_ktx2_file.size();

			append_vector(m_output_ktx2_file, etc1s_global_data);
		}

		// mipPadding
		if (header.m_supercompression_scheme == basist::KTX2_SS_NONE)
		{
			// We currently can't do this or the validator will incorrectly give an error.
			uint32_t ofs = m_output_ktx2_file.size() & 15;
			uint32_t padding = (16 - ofs) & 15;

			// Make sure we're always aligned here (due to a validator bug).
			if (padding)
			{
				printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n", padding);
			}

			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);
		}

		// Level data - write the smallest mipmap first.
		for (int level = total_levels - 1; level >= 0; level--)
		{
			level_index_array[level].m_byte_length = compressed_level_data_bytes[level].size();
			if (m_params.m_uastc)
				level_index_array[level].m_uncompressed_byte_length = level_data_bytes[level].size();

			level_index_array[level].m_byte_offset = m_output_ktx2_file.size();
			append_vector(m_output_ktx2_file, compressed_level_data_bytes[level]);
		}
		
		// Write final header
		memcpy(m_output_ktx2_file.data(), &header, sizeof(header));

		// Write final level index array
		memcpy(m_output_ktx2_file.data() + sizeof(header), level_index_array.data(), level_index_array.size_in_bytes());

		debug_printf("Total .ktx2 output file size: %u\n", m_output_ktx2_file.size());

		return true;
	}